

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VMake(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int myid_local;
  sunindextype local_length_local;
  N_Vector X_local;
  
  if (X == (N_Vector)0x0) {
    printf(">>> FAILED test -- N_VMake, Proc %d \n",(ulong)(uint)myid);
    printf("    After N_VMakeEmpty, X == NULL \n \n");
    X_local._4_4_ = 1;
  }
  else {
    iVar1 = has_data(X);
    if (iVar1 == 0) {
      printf(">>> FAILED test -- N_VMake, Proc %d \n",(ulong)(uint)myid);
      printf("    Vector data == NULL \n \n");
      X_local._4_4_ = 1;
    }
    else {
      if (myid == 0) {
        printf("PASSED test -- N_VMake \n");
      }
      X_local._4_4_ = 0;
    }
  }
  return X_local._4_4_;
}

Assistant:

int Test_N_VMake(N_Vector X, sunindextype local_length, int myid)
{
  /* check if vector is NULL */
  if (X == NULL) {
    printf(">>> FAILED test -- N_VMake, Proc %d \n", myid);
    printf("    After N_VMakeEmpty, X == NULL \n \n");
    return(1);
  }

  /* check for vector data */
  if (!has_data(X)) {
    printf(">>> FAILED test -- N_VMake, Proc %d \n", myid);
    printf("    Vector data == NULL \n \n");
    return(1);
  }

  if (myid == 0)
    printf("PASSED test -- N_VMake \n");

  return(0);
}